

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

size_t ZSTD_ldm_fillFastTables(ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,void *end)

{
  int in_EDX;
  long in_RSI;
  long in_RDI;
  BYTE *iend;
  undefined4 in_stack_00000028;
  ZSTD_dictTableLoadMethod_e in_stack_0000002c;
  ZSTD_matchState_t *in_stack_00000030;
  ZSTD_compressionParameters *in_stack_00000038;
  ZSTD_matchState_t *in_stack_00000040;
  
  if (*(int *)(in_RSI + 0x18) == 1) {
    ZSTD_fillHashTable(in_stack_00000030,
                       (ZSTD_compressionParameters *)CONCAT44(in_stack_0000002c,in_stack_00000028),
                       ms,cParams._4_4_);
    *(int *)(in_RDI + 0x24) = in_EDX - (int)*(undefined8 *)(in_RDI + 8);
  }
  else if (*(int *)(in_RSI + 0x18) == 2) {
    ZSTD_fillDoubleHashTable
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_0000002c);
    *(int *)(in_RDI + 0x24) = in_EDX - (int)*(undefined8 *)(in_RDI + 8);
  }
  return 0;
}

Assistant:

static size_t ZSTD_ldm_fillFastTables(ZSTD_matchState_t* ms,
                                      ZSTD_compressionParameters const* cParams,
                                      void const* end)
{
    const BYTE* const iend = (const BYTE*)end;

    switch(cParams->strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, cParams, iend, ZSTD_dtlm_fast);
        ms->nextToUpdate = (U32)(iend - ms->window.base);
        break;

    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, cParams, iend, ZSTD_dtlm_fast);
        ms->nextToUpdate = (U32)(iend - ms->window.base);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
    case ZSTD_btlazy2:
    case ZSTD_btopt:
    case ZSTD_btultra:
        break;
    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    return 0;
}